

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_block_queue.h
# Opt level: O0

FuncCallInfo * __thiscall
cppnet::ThreadSafeBlockQueue<FuncCallInfo_*>::Pop(ThreadSafeBlockQueue<FuncCallInfo_*> *this)

{
  value_type pFVar1;
  reference ppFVar2;
  type ret;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  ThreadSafeBlockQueue<FuncCallInfo_*> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->_mutex);
  std::_V2::condition_variable_any::
  wait<std::mutex,cppnet::ThreadSafeBlockQueue<FuncCallInfo*>::Pop()::_lambda()_1_>
            (&this->_empty_notify,&this->_mutex,(anon_class_8_1_8991fb9c)this);
  ppFVar2 = std::queue<FuncCallInfo_*,_std::deque<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>_>
            ::front(&this->_queue);
  pFVar1 = *ppFVar2;
  std::queue<FuncCallInfo_*,_std::deque<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>_>::pop
            (&this->_queue);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return pFVar1;
}

Assistant:

T Pop() {
        std::unique_lock<std::mutex> lock(_mutex);
        _empty_notify.wait(_mutex, [this]() {return !this->_queue.empty(); });

        auto ret = std::move(_queue.front());
        _queue.pop();
 
        return ret;
    }